

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

string * __thiscall
helics::CoreBroker::quickBrokerQueries_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view request)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  string *psVar5;
  reference pvVar6;
  char *__s;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  format_args args;
  allocator<char> local_99;
  json base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  data local_50;
  data local_40;
  
  __y._M_str = "isinit";
  __y._M_len = 6;
  bVar3 = std::operator==(request,__y);
  if (bVar3) {
    if ((this->super_BrokerBase).brokerState._M_i < OPERATING) {
LAB_00290f5d:
      __s = "false";
      goto LAB_00290f64;
    }
  }
  else {
    __y_00._M_str = "isconnected";
    __y_00._M_len = 0xb;
    bVar3 = std::operator==(request,__y_00);
    if (bVar3) {
      if (6 < (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR))
      goto LAB_00290f5d;
    }
    else {
      __y_01._M_str = "name";
      __y_01._M_len = 4;
      bVar3 = std::operator==(request,__y_01);
      if ((bVar3) ||
         (__y_02._M_str = "identifier", __y_02._M_len = 10, bVar3 = std::operator==(request,__y_02),
         bVar3)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\"",&local_99);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                       &local_70,&(this->super_BrokerBase).identifier);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                       '\"');
LAB_00290ff1:
        std::__cxx11::string::~string((string *)&base);
        std::__cxx11::string::~string((string *)&local_70);
        return __return_storage_ptr__;
      }
      __y_03._M_str = "exists";
      __y_03._M_len = 6;
      bVar3 = std::operator==(request,__y_03);
      if (!bVar3) {
        __y_04._M_str = "queries";
        __y_04._M_len = 7;
        bVar3 = std::operator==(request,__y_04);
        if ((bVar3) ||
           (__y_05._M_str = "available_queries", __y_05._M_len = 0x11,
           bVar3 = std::operator==(request,__y_05), bVar3)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
          for (p_Var4 = (_Rb_tree_node_base *)querySet_abi_cxx11_._24_8_;
              p_Var4 != (_Rb_tree_node_base *)(querySet_abi_cxx11_ + 8);
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            std::__cxx11::string::string
                      ((string *)&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var4 + 1));
            generateJsonQuotedString((string *)&base,(string *)&local_70);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
            std::__cxx11::string::~string((string *)&base);
            std::__cxx11::string::~string((string *)&local_70);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,',');
          }
          if (1 < __return_storage_ptr__->_M_string_length) {
            (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
                 = ']';
            return __return_storage_ptr__;
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,']');
          return __return_storage_ptr__;
        }
        __y_06._M_str = "address";
        __y_06._M_len = 7;
        bVar3 = std::operator==(request,__y_06);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\"",&local_99);
          psVar5 = getAddress_abi_cxx11_(this);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                         &local_70,psVar5);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                         '\"');
        }
        else {
          __y_07._M_str = "version";
          __y_07._M_len = 7;
          bVar3 = std::operator==(request,__y_07);
          if (!bVar3) {
            __y_08._M_str = "counter";
            __y_08._M_len = 7;
            bVar3 = std::operator==(request,__y_08);
            if (bVar3) {
              base.m_data._0_4_ = generateMapObjectCounter(this);
              fmt.size_ = 1;
              fmt.data_ = (char *)0x2;
              args.field_1.args_ = in_R9.args_;
              args.desc_ = (unsigned_long_long)&base;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)__return_storage_ptr__,(v11 *)0x34b5fe,fmt,args);
              return __return_storage_ptr__;
            }
            __y_09._M_str = "status";
            __y_09._M_len = 6;
            bVar3 = std::operator==(request,__y_09);
            if (bVar3) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json(&base,(nullptr_t)0x0);
              BrokerBase::addBaseInformation
                        (&this->super_BrokerBase,&base,
                         (bool)((this->super_BrokerBase).field_0x294 ^ 1));
              psVar5 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_40,psVar5);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&base,"state");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_40.m_type;
              jVar2 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_40.m_value;
              local_40.m_type = vVar1;
              local_40.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_40);
              local_70._M_dataplus._M_p._0_1_ =
                   (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<bool,_bool,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_50,(bool *)&local_70);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&base,"status");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_50.m_type;
              jVar2 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_50.m_value;
              local_50.m_type = vVar1;
              local_50.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_50);
              fileops::generateJsonString((string *)__return_storage_ptr__,&base,true);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&base.m_data);
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            return __return_storage_ptr__;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\"",&local_99);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                         &local_70,"3.6.1 (2025-02-24)");
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                         '\"');
        }
        goto LAB_00290ff1;
      }
    }
  }
  __s = "true";
LAB_00290f64:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&base);
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::quickBrokerQueries(std::string_view request) const
{
    if (request == "isinit") {
        return (getBrokerState() >= BrokerState::OPERATING) ? std::string("true") :
                                                              std::string("false");
    }
    if (request == "isconnected") {
        return (isConnected()) ? std::string("true") : std::string("false");
    }
    if (request == "name" || request == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (request == "exists") {
        return "true";
    }
    if ((request == "queries") || (request == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (request == "address") {
        return std::string{"\""} + getAddress() + '"';
    }
    if (request == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (request == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (request == "status") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        return fileops::generateJsonString(base);
    }
    return {};
}